

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void bwtil::save_bitview_to_file(bitview_t *bv,size_t size,FILE *fp)

{
  FILE *in_RDX;
  ulong in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  bitview<std::vector> *in_stack_00000008;
  ulint x;
  ulint i;
  word_type local_28;
  ulong local_20;
  FILE *local_18;
  ulong local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  for (local_20 = 0; local_20 + 0x40 <= local_10; local_20 = local_20 + 0x40) {
    local_28 = ::bv::internal::bitview<std::vector>::get(in_stack_00000008,unaff_retaddr,in_RDI);
    fwrite(&local_28,8,1,local_18);
  }
  if (local_20 < local_10) {
    local_28 = ::bv::internal::bitview<std::vector>::get(in_stack_00000008,unaff_retaddr,in_RDI);
    fwrite(&local_28,8,1,local_18);
  }
  return;
}

Assistant:

inline void save_bitview_to_file(bitview_t bv, size_t size, FILE * fp){

	ulint i = 0;
	ulint x;

	while(i+64<=size){

		x = bv.get(i,i+64);
		fwrite(&x, sizeof(ulint), 1, fp);

		i+=64;

	}

	if(i<size){

		x = bv.get(i,size);
		fwrite(&x, sizeof(ulint), 1, fp);

	}

}